

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O2

void __thiscall ScriptMemoryDumper::Init(ScriptMemoryDumper *this)

{
  PropertyId PVar1;
  DynamicObject *pDVar2;
  
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<10ul>
                    (this->scriptContext,(char16 (*) [10])L"pageCount");
  this->pageCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<11ul>
                    (this->scriptContext,(char16 (*) [11])L"objectSize");
  this->objectSizeId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<16ul>
                    (this->scriptContext,(char16 (*) [16])L"freeObjectCount");
  this->freeObjectCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<18ul>
                    (this->scriptContext,(char16 (*) [18])L"activeObjectCount");
  this->activeObjectCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<15ul>
                    (this->scriptContext,(char16 (*) [15])L"totalByteCount");
  this->totalByteCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<14ul>
                    (this->scriptContext,(char16 (*) [14])L"finalizeCount");
  this->finalizeCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<19ul>
                    (this->scriptContext,(char16 (*) [19])L"weakReferenceCount");
  this->weakReferenceCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<13ul>
                    (this->scriptContext,(char16 (*) [13])L"largeObjects");
  this->largeObjectsId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<21ul>
                    (this->scriptContext,(char16 (*) [21])L"activeObjectByteSize");
  this->activeObjectByteSizeId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked<8ul>
                    (this->scriptContext,(char16 (*) [8])L"summary");
  this->summaryId = PVar1;
  pDVar2 = Js::JavascriptLibrary::CreateObject
                     ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  this->dumpObject = pDVar2;
  return;
}

Assistant:

void ScriptMemoryDumper::Init()
{
    pageCountId = scriptContext->GetOrAddPropertyIdTracked(_u("pageCount"));
    objectSizeId = scriptContext->GetOrAddPropertyIdTracked(_u("objectSize"));
    freeObjectCountId = scriptContext->GetOrAddPropertyIdTracked(_u("freeObjectCount"));
    activeObjectCountId = scriptContext->GetOrAddPropertyIdTracked(_u("activeObjectCount"));
    totalByteCountId = scriptContext->GetOrAddPropertyIdTracked(_u("totalByteCount"));
    finalizeCountId = scriptContext->GetOrAddPropertyIdTracked(_u("finalizeCount"));
    weakReferenceCountId = scriptContext->GetOrAddPropertyIdTracked(_u("weakReferenceCount"));
    largeObjectsId = scriptContext->GetOrAddPropertyIdTracked(_u("largeObjects"));
    activeObjectByteSizeId = scriptContext->GetOrAddPropertyIdTracked(_u("activeObjectByteSize"));
    summaryId = scriptContext->GetOrAddPropertyIdTracked(_u("summary"));
    dumpObject = scriptContext->GetLibrary()->CreateObject();
}